

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecsscan.c
# Opt level: O1

void thecl_yy_delete_buffer(YY_BUFFER_STATE b)

{
  YY_BUFFER_STATE pyVar1;
  
  if (b != (YY_BUFFER_STATE)0x0) {
    if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
      pyVar1 = (YY_BUFFER_STATE)0x0;
    }
    else {
      pyVar1 = yy_buffer_stack[yy_buffer_stack_top];
    }
    if (pyVar1 == b) {
      yy_buffer_stack[yy_buffer_stack_top] = (YY_BUFFER_STATE)0x0;
    }
    if (b->yy_is_our_buffer != 0) {
      free(b->yy_ch_buf);
    }
    free(b);
    return;
  }
  return;
}

Assistant:

void yy_delete_buffer (YY_BUFFER_STATE  b )
{
    
	if ( ! b )
		return;

	if ( b == YY_CURRENT_BUFFER ) /* Not sure if we should pop here. */
		YY_CURRENT_BUFFER_LVALUE = (YY_BUFFER_STATE) 0;

	if ( b->yy_is_our_buffer )
		yyfree( (void *) b->yy_ch_buf  );

	yyfree( (void *) b  );
}